

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoding.c
# Opt level: O2

exr_result_t read_uncompressed_direct(exr_decode_pipeline_t *decode)

{
  int iVar1;
  uint uVar2;
  exr_const_context_t p_Var3;
  exr_coding_channel_info_t *peVar4;
  exr_result_t eVar5;
  int iVar6;
  ulong uVar7;
  long lVar8;
  long lVar9;
  ulong uVar10;
  long lVar11;
  uint64_t dataoffset;
  
  p_Var3 = decode->context;
  if (p_Var3 == (exr_const_context_t)0x0) {
    eVar5 = 2;
  }
  else {
    if (*p_Var3 != (_priv_exr_context_t)0x0) {
      eVar5 = (**(code **)(p_Var3 + 0x38))(p_Var3,7);
      return eVar5;
    }
    iVar1 = decode->part_index;
    if ((iVar1 < 0) || (*(int *)(p_Var3 + 0xc4) <= iVar1)) {
      eVar5 = (**(code **)(p_Var3 + 0x48))
                        (p_Var3,4,"Part index (%d) out of range",iVar1,*(code **)(p_Var3 + 0x48));
      return eVar5;
    }
    dataoffset = (decode->chunk).data_offset;
    iVar1 = (decode->chunk).start_y;
    uVar2 = (decode->chunk).height;
    uVar7 = (ulong)uVar2;
    if ((int)uVar2 < 1) {
      uVar7 = 0;
    }
    for (uVar10 = 0; uVar10 != uVar7; uVar10 = uVar10 + 1) {
      lVar11 = 0x28;
      for (lVar9 = 0; lVar9 < decode->channel_count; lVar9 = lVar9 + 1) {
        peVar4 = decode->channels;
        if (*(int *)((long)peVar4 + lVar11 + -0x20) != 0) {
          uVar2 = *(uint *)((long)peVar4 + lVar11 + -0x14);
          if ((int)uVar2 < 2) {
            lVar8 = (long)*(int *)((long)peVar4 + lVar11 + -4) * uVar10;
          }
          else {
            if ((iVar1 + (int)uVar10) % (int)uVar2 != 0) goto LAB_0011ee89;
            lVar8 = (long)*(int *)((long)peVar4 + lVar11 + -4) *
                    ((uVar10 & 0xffffffff) / (ulong)uVar2);
          }
          iVar6 = (**(code **)(p_Var3 + 0x28))
                            (p_Var3,*(long *)((long)&peVar4->channel_name + lVar11) + lVar8,
                             (long)*(char *)((long)peVar4 + lVar11 + -0xf) *
                             (long)*(int *)((long)peVar4 + lVar11 + -0x1c),&dataoffset,0,0);
          if (iVar6 != 0) {
            return iVar6;
          }
        }
LAB_0011ee89:
        lVar11 = lVar11 + 0x30;
      }
    }
    eVar5 = 0;
  }
  return eVar5;
}

Assistant:

static exr_result_t
read_uncompressed_direct (exr_decode_pipeline_t* decode)
{
    exr_result_t rv;
    int          height, start_y;
    uint64_t     dataoffset, toread;
    uint8_t*     cdata;
    EXR_PROMOTE_READ_CONST_CONTEXT_AND_PART_OR_ERROR (
        decode->context, decode->part_index);

    dataoffset = decode->chunk.data_offset;

    height  = decode->chunk.height;
    start_y = decode->chunk.start_y;
    for (int y = 0; y < height; ++y)
    {
        for (int c = 0; c < decode->channel_count; ++c)
        {
            exr_coding_channel_info_t* decc = (decode->channels + c);

            cdata = decc->decode_to_ptr;
            toread =
                (uint64_t) decc->width * (uint64_t) decc->bytes_per_element;

            if (decc->height == 0) continue;

            if (decc->y_samples > 1)
            {
                if (((start_y + y) % decc->y_samples) != 0) continue;
                cdata +=
                    ((uint64_t) (y / decc->y_samples) *
                     (uint64_t) decc->user_line_stride);
            }
            else
            {
                cdata += (uint64_t) y * (uint64_t) decc->user_line_stride;
            }

            /* actual read into the output pointer */
            rv = pctxt->do_read (
                pctxt, cdata, toread, &dataoffset, NULL, EXR_MUST_READ_ALL);
            if (rv != EXR_ERR_SUCCESS) return rv;

            // need to swab them to native
            if (decc->bytes_per_element == 2)
                priv_to_native16 (cdata, decc->width);
            else
                priv_to_native32 (cdata, decc->width);
        }
    }

    return EXR_ERR_SUCCESS;
}